

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_addrinfo * get_localhost6(int port,char *name)

{
  sockaddr *psVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  undefined8 uStack_68;
  unsigned_short port16;
  uchar ipv6 [16];
  sockaddr_in6 sa6;
  size_t hostlen;
  size_t ss_size;
  Curl_addrinfo *ca;
  char *name_local;
  Curl_addrinfo *pCStack_10;
  int port_local;
  
  sVar4 = strlen(name);
  pCStack_10 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar4 + 0x4d);
  if (pCStack_10 == (Curl_addrinfo *)0x0) {
    pCStack_10 = (Curl_addrinfo *)0x0;
  }
  else {
    ipv6[0xc] = '\n';
    ipv6[0xd] = '\0';
    ipv6._14_2_ = htons((uint16_t)port);
    iVar3 = inet_pton(10,"::1",&stack0xffffffffffffff98);
    if (iVar3 < 1) {
      pCStack_10 = (Curl_addrinfo *)0x0;
    }
    else {
      pCStack_10->ai_flags = 0;
      pCStack_10->ai_family = 10;
      pCStack_10->ai_socktype = 1;
      pCStack_10->ai_protocol = 6;
      pCStack_10->ai_addrlen = 0x1c;
      pCStack_10->ai_next = (Curl_addrinfo *)0x0;
      pCStack_10->ai_addr = (sockaddr *)(pCStack_10 + 1);
      psVar1 = pCStack_10->ai_addr;
      uVar2 = (ulong)CONCAT22(ipv6._14_2_,ipv6._12_2_);
      psVar1->sa_family = (short)uVar2;
      psVar1->sa_data[0] = (char)(uVar2 >> 0x10);
      psVar1->sa_data[1] = (char)(uVar2 >> 0x18);
      psVar1->sa_data[2] = (char)(uVar2 >> 0x20);
      psVar1->sa_data[3] = (char)(uVar2 >> 0x28);
      psVar1->sa_data[4] = (char)(uVar2 >> 0x30);
      psVar1->sa_data[5] = (char)(uVar2 >> 0x38);
      *(undefined8 *)(psVar1->sa_data + 6) = uStack_68;
      *(undefined8 *)(psVar1 + 1) = ipv6._0_8_;
      psVar1[1].sa_data[6] = '\0';
      psVar1[1].sa_data[7] = '\0';
      psVar1[1].sa_data[8] = '\0';
      psVar1[1].sa_data[9] = '\0';
      pCStack_10->ai_canonname = pCStack_10->ai_addr[1].sa_data + 10;
      strcpy(pCStack_10->ai_canonname,name);
    }
  }
  return pCStack_10;
}

Assistant:

static struct Curl_addrinfo *get_localhost6(int port, const char *name)
{
  struct Curl_addrinfo *ca;
  const size_t ss_size = sizeof(struct sockaddr_in6);
  const size_t hostlen = strlen(name);
  struct sockaddr_in6 sa6;
  unsigned char ipv6[16];
  unsigned short port16 = (unsigned short)(port & 0xffff);
  ca = calloc(1, sizeof(struct Curl_addrinfo) + ss_size + hostlen + 1);
  if(!ca)
    return NULL;

  sa6.sin6_family = AF_INET6;
  sa6.sin6_port = htons(port16);
  sa6.sin6_flowinfo = 0;
  sa6.sin6_scope_id = 0;
  if(Curl_inet_pton(AF_INET6, "::1", ipv6) < 1)
    return NULL;
  memcpy(&sa6.sin6_addr, ipv6, sizeof(ipv6));

  ca->ai_flags     = 0;
  ca->ai_family    = AF_INET6;
  ca->ai_socktype  = SOCK_STREAM;
  ca->ai_protocol  = IPPROTO_TCP;
  ca->ai_addrlen   = (curl_socklen_t)ss_size;
  ca->ai_next      = NULL;
  ca->ai_addr = (void *)((char *)ca + sizeof(struct Curl_addrinfo));
  memcpy(ca->ai_addr, &sa6, ss_size);
  ca->ai_canonname = (char *)ca->ai_addr + ss_size;
  strcpy(ca->ai_canonname, name);
  return ca;
}